

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

void sysbvm_functionBytecodeDirectCompiler_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_context_t *context_local;
  
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astNodeType,sysbvm_astNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astBreakNodeType,
             sysbvm_astBreakNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astCoerceValueNodeType,
             sysbvm_astCoerceValueNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astContinueNodeType,
             sysbvm_astContinueNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astDoWhileContinueWithNodeType,
             sysbvm_astDoWhileContinueWithNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astDownCastNodeType,
             sysbvm_astDownCastNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astFunctionApplicationNodeType,
             sysbvm_astFunctionApplicationNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astIdentifierReferenceNodeType,
             sysbvm_astIdentifierReferenceNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astIfNodeType,sysbvm_astIfNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astLambdaNodeType,
             sysbvm_astLambdaNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astLexicalBlockNodeType,
             sysbvm_astLexicalBlockNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astLiteralNodeType,
             sysbvm_astLiteralNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astVariableDefinitionNodeType,
             sysbvm_astVariableDefinitionNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astMakeArrayNodeType,
             sysbvm_astMakeArrayNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astMakeAssociationNodeType,
             sysbvm_astMakeAssociationNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astMakeByteArrayNodeType,
             sysbvm_astMakeByteArrayNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astMakeDictionaryNodeType,
             sysbvm_astMakeDictionaryNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astMessageSendNodeType,
             sysbvm_astMessageSendNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astReturnNodeType,
             sysbvm_astReturnNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astSequenceNodeType,
             sysbvm_astSequenceNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astSwitchNodeType,
             sysbvm_astSwitchNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astTupleSlotNamedAtNodeType,
             sysbvm_astTupleSlotNamedAtNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astTupleSlotNamedAtPutNodeType,
             sysbvm_astTupleSlotNamedAtPutNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astTupleSlotNamedReferenceAtNodeType,
             sysbvm_astTupleSlotNamedReferenceAtNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astUseNamedSlotsOfNodeType,
             sysbvm_astUseNamedSlotsOfNode_primitiveCompileIntoBytecode);
  sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction
            (context,(context->roots).astWhileContinueWithNodeType,
             sysbvm_astWhileContinueNode_primitiveCompileIntoBytecode);
  return;
}

Assistant:

void sysbvm_functionBytecodeDirectCompiler_setupPrimitives(sysbvm_context_t *context)
{
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astNodeType, &sysbvm_astNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astBreakNodeType, &sysbvm_astBreakNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astCoerceValueNodeType, &sysbvm_astCoerceValueNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astContinueNodeType, &sysbvm_astContinueNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astDoWhileContinueWithNodeType, &sysbvm_astDoWhileContinueWithNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astDownCastNodeType, &sysbvm_astDownCastNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astFunctionApplicationNodeType, &sysbvm_astFunctionApplicationNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astIdentifierReferenceNodeType, &sysbvm_astIdentifierReferenceNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astIfNodeType, &sysbvm_astIfNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astLambdaNodeType, &sysbvm_astLambdaNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astLexicalBlockNodeType, &sysbvm_astLexicalBlockNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astLiteralNodeType, &sysbvm_astLiteralNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astVariableDefinitionNodeType, &sysbvm_astVariableDefinitionNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astMakeArrayNodeType, &sysbvm_astMakeArrayNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astMakeAssociationNodeType, &sysbvm_astMakeAssociationNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astMakeByteArrayNodeType, &sysbvm_astMakeByteArrayNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astMakeDictionaryNodeType, &sysbvm_astMakeDictionaryNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astMessageSendNodeType, &sysbvm_astMessageSendNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astReturnNodeType, &sysbvm_astReturnNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astSequenceNodeType, &sysbvm_astSequenceNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astSwitchNodeType, &sysbvm_astSwitchNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astTupleSlotNamedAtNodeType, &sysbvm_astTupleSlotNamedAtNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astTupleSlotNamedAtPutNodeType, &sysbvm_astTupleSlotNamedAtPutNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astTupleSlotNamedReferenceAtNodeType, &sysbvm_astTupleSlotNamedReferenceAtNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astUseNamedSlotsOfNodeType, &sysbvm_astUseNamedSlotsOfNode_primitiveCompileIntoBytecode);
    sysbvm_functionBytecodeDirectCompiler_setupNodeCompilationFunction(context, context->roots.astWhileContinueWithNodeType, &sysbvm_astWhileContinueNode_primitiveCompileIntoBytecode);
}